

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ronan.cpp
# Opt level: O1

void ronanCBProcess(syWRonan *wsptr,float *buf,uint32_t len)

{
  ResDef *pRVar1;
  ResDef *pRVar2;
  ResDef *pRVar3;
  float *pfVar4;
  uint32_t i;
  long lVar5;
  uint32_t i_1;
  ulong uVar6;
  uint32_t uVar7;
  ulong uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float afStack_84 [8];
  syVRonan deltaframe;
  
  lVar5 = 0;
  do {
    afStack_84[lVar5] =
         ((&(wsptr->newframe).rdef[0].a)[lVar5] - (&(wsptr->super_syVRonan).rdef[0].a)[lVar5]) *
         (1.0 / (float)len);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x19);
  if (len != 0) {
    pRVar1 = wsptr->res[0].def;
    pRVar2 = wsptr->res[1].def;
    pRVar3 = (wsptr->peq1).def;
    uVar7 = wsptr->nseed;
    uVar8 = 0;
    do {
      lVar5 = 0;
      do {
        (&(wsptr->super_syVRonan).rdef[0].a)[lVar5] =
             afStack_84[lVar5] + (&(wsptr->super_syVRonan).rdef[0].a)[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x19);
      uVar6 = (ulong)(uint)((int)uVar8 * 2);
      fVar10 = buf[uVar6];
      fVar9 = wsptr->nout * 0.75 + (float)(uVar7 * 0xbb38435 + 0x3619636b >> 9 | 0x40000000) + -3.0;
      wsptr->nout = fVar9;
      fVar12 = fVar10 * (wsptr->super_syVRonan).a_voicing +
               fVar9 * 0.25 * (wsptr->super_syVRonan).a_aspiration;
      fVar10 = wsptr->res[0].p1;
      fVar11 = wsptr->res[1].p1;
      fVar14 = pRVar1->c * wsptr->res[0].p2 + pRVar1->a * fVar12 + pRVar1->b * fVar10;
      wsptr->res[0].p2 = fVar10;
      wsptr->res[0].p1 = fVar14;
      fVar13 = pRVar2->c * wsptr->res[1].p2 + pRVar2->a * fVar12 + pRVar2->b * fVar11;
      wsptr->res[1].p2 = fVar11;
      wsptr->res[1].p1 = fVar13;
      fVar13 = fVar13 + fVar14;
      uVar7 = uVar7 * -0x4b9b4d07 + 0x9d6f2492;
      fVar10 = fVar9 * 0.75 + (float)(uVar7 >> 9 | 0x40000000) + -3.0;
      wsptr->nout = fVar10;
      fVar10 = (fVar10 * 0.25 * (wsptr->super_syVRonan).a_frication + fVar12) - wsptr->lastin2;
      wsptr->lastin2 = fVar12;
      lVar5 = 0;
      do {
        pfVar4 = *(float **)((long)&wsptr->res[2].def + lVar5);
        fVar11 = *(float *)((long)&wsptr->res[2].p1 + lVar5);
        fVar9 = pfVar4[2] * *(float *)((long)&wsptr->res[2].p2 + lVar5) +
                *pfVar4 * fVar10 + pfVar4[1] * fVar11;
        *(float *)((long)&wsptr->res[2].p2 + lVar5) = fVar11;
        *(float *)((long)&wsptr->res[2].p1 + lVar5) = fVar9;
        fVar13 = fVar9 - fVar13;
        lVar5 = lVar5 + 0x10;
      } while (lVar5 != 0x50);
      fVar11 = (fVar10 * (wsptr->super_syVRonan).a_bypass - fVar13) - wsptr->hpb1;
      wsptr->hpb1 = fVar11 * 0.012 + wsptr->hpb1;
      fVar11 = fVar11 - wsptr->hpb2;
      wsptr->hpb2 = fVar11 * 0.012 + wsptr->hpb2;
      fVar10 = (wsptr->peq1).p1;
      fVar9 = pRVar3->c * (wsptr->peq1).p2 + pRVar3->a * fVar11 + pRVar3->b * fVar10;
      (wsptr->peq1).p2 = fVar10;
      (wsptr->peq1).p1 = fVar9;
      fVar9 = fVar9 - fVar11;
      buf[uVar6 + 1] = fVar9;
      buf[uVar6] = fVar9;
      uVar8 = uVar8 + 1;
    } while (uVar8 != len);
    wsptr->nseed = uVar7;
  }
  return;
}

Assistant:

void ronanCBProcess(syWRonan *wsptr, float *buf, uint32_t len)
{
    syVRonan deltaframe;

    // prepare interpolation
    {
        float *src1 = (float*)wsptr;
        float *src2 = (float*)&wsptr->newframe;
        float *dest = (float*)&deltaframe;
        float mul   = 1.0f/(float)len;
        for (uint32_t i = 0; i < (sizeof(syVRonan)/sizeof(float)); i++)
            dest[i] = (src2[i] - src1[i])*mul;
    }

    for (uint32_t i = 0; i < len; i++)
    {
        // interpolate all values
        {
            float *src  = (float*)&deltaframe;
            float *dest = (float*)wsptr;
            for (uint32_t i = 0; i < (sizeof(syVRonan)/sizeof(float)); i++)
                dest[i] += src[i];
        }

        float in = buf[2*i];

        // add aspiration noise
        in = in*wsptr->a_voicing + wsptr->noise()*wsptr->a_aspiration;

        // process complete input signal with f1/nasal filters
        float out = wsptr->res[0].tick(in) + wsptr->res[1].tick(in);

        // differentiate input signal, add frication noise
        float lin = in;
        in = (wsptr->noise()*wsptr->a_frication) + in - wsptr->lastin2;
        wsptr->lastin2 = lin;

        // process diff/fric input signal with f2..f6 and bypass (phase inverted)
        for (int r = 2; r < 7; r++)
            out = wsptr->res[r].tick(in) - out;

        out = in*wsptr->a_bypass - out;

        // high pass filter
        wsptr->hpb1 += 0.012f*(out = out - wsptr->hpb1);
        wsptr->hpb2 += 0.012f*(out = out - wsptr->hpb2);

        // EQ
        out = wsptr->peq1.tick(out) - out;

        buf[2*i] = buf[2*i + 1] = out;
    }
}